

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode
          (sysbvm_context_t *context,sysbvm_tuple_t node)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t dummyValue;
  sysbvm_metatype_t *metatype;
  sysbvm_tuple_t baseTypeMethod;
  sysbvm_tuple_t method;
  sysbvm_tuple_t analyzedType;
  sysbvm_tuple_t node_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_astNode_isLiteralNode(context,node);
  if (_Var1) {
    context_local = (sysbvm_context_t *)sysbvm_astLiteralNode_getValue(node);
  }
  else {
    method = sysbvm_astNode_getAnalyzedType(node);
    sVar2 = sysbvm_tuple_getType(context,method);
    sVar2 = sysbvm_type_lookupSelector
                      (context,sVar2,
                       (context->roots).getOrCreateDependentApplicationValueForNodeSelector);
    if (sVar2 == 0) {
      _Var1 = sysbvm_type_isReferenceType(method);
      if (_Var1) {
        method = *(sysbvm_tuple_t *)(method + 0xf8);
        sVar2 = sysbvm_tuple_getType(context,method);
        sVar2 = sysbvm_type_lookupSelector
                          (context,sVar2,
                           (context->roots).getOrCreateDependentApplicationValueForNodeSelector);
        if (sVar2 != 0) {
          sVar2 = sysbvm_function_apply2(context,sVar2,method,node);
          return sVar2;
        }
      }
      _Var1 = sysbvm_tuple_isKindOf(context,method,(context->roots).metatypeType);
      if ((_Var1) && (*(long *)(method + 0xf8) != 0)) {
        context_local = *(sysbvm_context_t **)(method + 0xf8);
      }
      else {
        context_local = (sysbvm_context_t *)sysbvm_context_allocatePointerTuple(context,method,0);
        sysbvm_tuple_markDummyValue((sysbvm_tuple_t)context_local);
      }
    }
    else {
      context_local = (sysbvm_context_t *)sysbvm_function_apply2(context,sVar2,method,node);
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode(sysbvm_context_t *context, sysbvm_tuple_t node)
{
    // Unwrap the literal values.
    if(sysbvm_astNode_isLiteralNode(context, node))
        return sysbvm_astLiteralNode_getValue(node);

    // Get the analyzed type of the node.
    sysbvm_tuple_t analyzedType = sysbvm_astNode_getAnalyzedType(node);

    // Find a method.
    sysbvm_tuple_t method = sysbvm_type_lookupSelector(context, sysbvm_tuple_getType(context, analyzedType), context->roots.getOrCreateDependentApplicationValueForNodeSelector);
    if(method)
        return sysbvm_function_apply2(context, method, analyzedType, node);

    // Use the base type in the case of reference types.
    if(sysbvm_type_isReferenceType(analyzedType))
    {
        analyzedType = ((sysbvm_referenceType_t*)analyzedType)->super.baseType;
        sysbvm_tuple_t baseTypeMethod = sysbvm_type_lookupSelector(context, sysbvm_tuple_getType(context, analyzedType), context->roots.getOrCreateDependentApplicationValueForNodeSelector);
        if(baseTypeMethod)
            return sysbvm_function_apply2(context, baseTypeMethod, analyzedType, node);
    }

    // If the node is a subtype of metatype, and this type is defined then return the type.
    if(sysbvm_tuple_isKindOf(context, analyzedType, context->roots.metatypeType))
    {
        sysbvm_metatype_t *metatype = (sysbvm_metatype_t*)analyzedType;
        if(metatype->thisType)
            return metatype->thisType;
    }

    // Construct a dummy value that has the same type
    sysbvm_tuple_t dummyValue = (sysbvm_tuple_t)sysbvm_context_allocatePointerTuple(context, analyzedType, 0);
    sysbvm_tuple_markDummyValue(dummyValue);
    return dummyValue;
}